

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

void __thiscall
NewClassExpression::AddElement
          (NewClassExpression *this,ExpressionPtr *key,ExpressionPtr *value,
          ExpressionPtr *attributes,bool isStatic)

{
  undefined1 local_68 [8];
  ClassElement element;
  bool isStatic_local;
  ExpressionPtr *attributes_local;
  ExpressionPtr *value_local;
  ExpressionPtr *key_local;
  NewClassExpression *this_local;
  
  element._55_1_ = isStatic;
  ClassElement::ClassElement((ClassElement *)local_68);
  std::shared_ptr<Expression>::operator=((shared_ptr<Expression> *)local_68,key);
  std::shared_ptr<Expression>::operator=
            ((shared_ptr<Expression> *)
             &element.key.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             value);
  std::shared_ptr<Expression>::operator=
            ((shared_ptr<Expression> *)
             &element.value.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             attributes);
  element.attributes.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_1_ = element._55_1_ & 1;
  std::vector<NewClassExpression::ClassElement,_std::allocator<NewClassExpression::ClassElement>_>::
  push_back(&this->m_Elements,(ClassElement *)local_68);
  ClassElement::~ClassElement((ClassElement *)local_68);
  return;
}

Assistant:

void AddElement( ExpressionPtr key, ExpressionPtr value, ExpressionPtr attributes, bool isStatic )
	{
		ClassElement element;
		element.key = key;
		element.value = value;
		element.attributes = attributes;
		element.isStatic = isStatic;

		m_Elements.push_back(element);
	}